

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void device_reset_okim6295(void *chip)

{
  long lVar1;
  
  *(undefined4 *)((long)chip + 0xd8) = *(undefined4 *)((long)chip + 0xdc);
  *(undefined1 *)((long)chip + 0xd0) = *(undefined1 *)((long)chip + 0xd1);
  *(undefined2 *)((long)chip + 200) = 0xffff;
  lVar1 = 0;
  *(undefined4 *)((long)chip + 0xcc) = 0;
  *(undefined1 *)((long)chip + 0xd2) = 0;
  *(undefined4 *)((long)chip + 0xd3) = 0;
  do {
    *(undefined4 *)((long)chip + lVar1 + 0x30) = 0;
    oki_adpcm_reset((oki_adpcm_state *)((long)chip + lVar1 + 8));
    *(undefined1 *)((long)chip + lVar1 + 0x20) = 0;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0xc0);
  return;
}

Assistant:

static void device_reset_okim6295(void *chip)
{
	okim6295_state *info = (okim6295_state *)chip;
	UINT8 voice;
	
	info->master_clock = info->initial_clock;
	info->pin7_state = info->pin7_initial;
	info->command = -1;
	info->bank_offs = 0;
	info->nmk_mode = 0x00;
	memset(info->nmk_bank, 0x00, 4 * sizeof(UINT8));
	
	for (voice = 0; voice < OKIM6295_VOICES; voice++)
	{
		info->voice[voice].volume = 0;
		oki_adpcm_reset(&info->voice[voice].adpcm);
		
		info->voice[voice].playing = 0;
	}
}